

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O0

int16_t WebRtcIsac_DecodeInterpolLpcUb
                  (Bitstr *streamdata,double *percepFilterParams,int16_t bandwidth)

{
  int iVar1;
  double *local_130;
  double *ptrOutParam;
  double percepFilterGains [12];
  short local_ba;
  short local_b8;
  short local_b6;
  int iStack_b4;
  int16_t numGains;
  int16_t numVecPerSegment;
  int16_t numSegments;
  int subframeCntr;
  int interpolCntr;
  int err;
  double lpcCoeff [16];
  int16_t bandwidth_local;
  double *percepFilterParams_local;
  Bitstr *streamdata_local;
  
  lpcCoeff[0xf]._6_2_ = bandwidth;
  iVar1 = WebRtcIsac_DecodeLpcCoefUB
                    (streamdata,(double *)&interpolCntr,(double *)&ptrOutParam,bandwidth);
  if (iVar1 < 0) {
    streamdata_local._6_2_ = -0x1a18;
  }
  else {
    if (lpcCoeff[0xf]._6_2_ == 0xc) {
      local_ba = 6;
      local_b6 = 1;
      local_b8 = 5;
    }
    else {
      if (lpcCoeff[0xf]._6_2_ != 0x10) {
        return -1;
      }
      local_ba = 0xc;
      local_b6 = 3;
      local_b8 = 4;
    }
    local_130 = percepFilterParams;
    for (_numVecPerSegment = 0; _numVecPerSegment < local_b6;
        _numVecPerSegment = _numVecPerSegment + 1) {
      WebRtcIsac_Lar2PolyInterpolUB
                ((double *)(&interpolCntr + (long)(_numVecPerSegment << 2) * 2),local_130,
                 local_b8 + 1);
      local_130 = local_130 + local_b8 * 5;
    }
    local_130 = percepFilterParams;
    if (lpcCoeff[0xf]._6_2_ == 0x10) {
      local_130 = percepFilterParams + 5;
    }
    for (iStack_b4 = 0; iStack_b4 < local_ba; iStack_b4 = iStack_b4 + 1) {
      *local_130 = percepFilterGains[(long)iStack_b4 + -1];
      local_130 = local_130 + 5;
    }
    streamdata_local._6_2_ = 0;
  }
  return streamdata_local._6_2_;
}

Assistant:

int16_t WebRtcIsac_DecodeInterpolLpcUb(Bitstr* streamdata,
                                       double* percepFilterParams,
                                       int16_t bandwidth) {
  double lpcCoeff[UB_LPC_ORDER * UB16_LPC_VEC_PER_FRAME];
  int err;
  int interpolCntr;
  int subframeCntr;
  int16_t numSegments;
  int16_t numVecPerSegment;
  int16_t numGains;

  double percepFilterGains[SUBFRAMES << 1];
  double* ptrOutParam = percepFilterParams;

  err = WebRtcIsac_DecodeLpcCoefUB(streamdata, lpcCoeff, percepFilterGains,
                                   bandwidth);
  if (err < 0) {
    return -ISAC_RANGE_ERROR_DECODE_LPC;
  }

  switch (bandwidth) {
    case isac12kHz: {
      numGains = SUBFRAMES;
      numSegments = UB_LPC_VEC_PER_FRAME - 1;
      numVecPerSegment = kLpcVecPerSegmentUb12;
      break;
    }
    case isac16kHz: {
      numGains = SUBFRAMES << 1;
      numSegments = UB16_LPC_VEC_PER_FRAME - 1;
      numVecPerSegment = kLpcVecPerSegmentUb16;
      break;
    }
    default:
      return -1;
  }

  for (interpolCntr = 0; interpolCntr < numSegments; interpolCntr++) {
    WebRtcIsac_Lar2PolyInterpolUB(&lpcCoeff[interpolCntr * UB_LPC_ORDER],
                                  ptrOutParam, numVecPerSegment + 1);
    ptrOutParam += (numVecPerSegment * (UB_LPC_ORDER + 1));
  }

  ptrOutParam = percepFilterParams;

  if (bandwidth == isac16kHz) {
    ptrOutParam += (1 + UB_LPC_ORDER);
  }

  for (subframeCntr = 0; subframeCntr < numGains; subframeCntr++) {
    *ptrOutParam = percepFilterGains[subframeCntr];
    ptrOutParam += (1 + UB_LPC_ORDER);
  }
  return 0;
}